

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O1

RGB __thiscall
RayTracer::processPixelOnPlane
          (RayTracer *this,Point *rayBeg,Point *pointOnPlane,const_iterator planeIt,
          int recursionLevel)

{
  Point *light;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ushort uVar4;
  Sphere *pSVar5;
  bool bVar6;
  RGB RVar7;
  uint uVar8;
  Plane *pPVar9;
  Plane *object;
  Sphere *object_00;
  bool bVar10;
  float fVar11;
  Segment local_80;
  undefined1 local_68 [8];
  Segment refl;
  
  light = &(this->super_RayTracerBase).config.super_BaseConfig.light;
  pPVar9 = (this->super_RayTracerBase).config.planes.
           super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
           _M_start;
  bVar10 = pPVar9 != planeIt._M_current;
  refl.b._4_8_ = rayBeg;
  if (bVar10) {
    bVar6 = pointInShadow<Plane>(pointOnPlane,light,pPVar9);
    while (!bVar6) {
      pPVar9 = pPVar9 + 1;
      bVar10 = pPVar9 != planeIt._M_current;
      if (pPVar9 == planeIt._M_current) break;
      bVar6 = pointInShadow<Plane>(pointOnPlane,light,pPVar9);
    }
  }
  if (!bVar10) {
    pPVar9 = (this->super_RayTracerBase).config.planes.
             super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    bVar10 = planeIt._M_current + 1 != pPVar9;
    if ((bVar10) &&
       (bVar6 = pointInShadow<Plane>(pointOnPlane,light,planeIt._M_current + 1), !bVar6)) {
      object = planeIt._M_current + 2;
      do {
        bVar10 = object != pPVar9;
        if (object == pPVar9) break;
        bVar6 = pointInShadow<Plane>(pointOnPlane,light,object);
        object = object + 1;
      } while (!bVar6);
    }
    if (!bVar10) {
      object_00 = (this->super_RayTracerBase).config.spheres.
                  super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pSVar5 = (this->super_RayTracerBase).config.spheres.
               super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      bVar10 = object_00 != pSVar5;
      if (bVar10) {
        bVar6 = pointInShadow<Sphere>(pointOnPlane,light,object_00);
        while (!bVar6) {
          object_00 = object_00 + 1;
          bVar10 = object_00 != pSVar5;
          if (object_00 == pSVar5) break;
          bVar6 = pointInShadow<Sphere>(pointOnPlane,light,object_00);
        }
      }
      if (!bVar10) {
        uVar2 = (this->super_RayTracerBase).config.super_BaseConfig.light.x;
        uVar3 = (this->super_RayTracerBase).config.super_BaseConfig.light.y;
        refl.a.x = (this->super_RayTracerBase).config.super_BaseConfig.light.z - pointOnPlane->z;
        local_68._4_4_ = (float)uVar3 - pointOnPlane->y;
        local_68._0_4_ = (float)uVar2 - pointOnPlane->x;
        RVar7 = calculateColorInLight
                          (this,(planeIt._M_current)->color,&(planeIt._M_current)->normal,
                           (Vector *)local_68);
        uVar8 = (uint)(uint3)RVar7;
        goto LAB_001056fc;
      }
    }
  }
  uVar4._0_1_ = ((planeIt._M_current)->color).r;
  uVar4._1_1_ = ((planeIt._M_current)->color).g;
  fVar1 = (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient;
  uVar8 = (int)((float)(uVar4 & 0xff) * fVar1) & 0xffU |
          ((int)((float)(uVar4 >> 8) * fVar1) & 0xffU) << 8 |
          (int)((float)((planeIt._M_current)->color).b * fVar1) << 0x10;
LAB_001056fc:
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS((planeIt._M_current)->reflectionCoefficient))) {
    local_80.a.z = *(float *)(refl.b._4_8_ + 8);
    local_80.a._0_8_ = *(undefined8 *)refl.b._4_8_;
    local_80.b.x = pointOnPlane->x;
    local_80.b.y = pointOnPlane->y;
    local_80.b.z = pointOnPlane->z;
    reflection(&local_80,planeIt._M_current);
    RVar7 = processPixel(this,(Segment *)local_68,recursionLevel + 1);
    fVar1 = (planeIt._M_current)->reflectionCoefficient;
    fVar11 = 1.0 - fVar1;
    uVar8 = (uint)(byte)((char)(int)((float)((uint3)RVar7 & 0xff) * fVar1) +
                        (char)(int)((float)(uVar8 & 0xff) * fVar11)) |
            (uint)(byte)((char)(int)((float)(RVar7._1_2_ & 0xff) * fVar1) +
                        (char)(int)((float)(uVar8 >> 8 & 0xff) * fVar11)) << 8 |
            (uint)(byte)((char)(int)((float)RVar7.b * fVar1) +
                        (char)(int)((float)(uVar8 >> 0x10 & 0xff) * fVar11)) << 0x10;
  }
  return SUB43(uVar8,0);
}

Assistant:

RGB RayTracer::processPixelOnPlane(Point const& rayBeg, Point const& pointOnPlane,
                                   std::vector<Plane>::const_iterator planeIt, int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnPlane, config.light, config.planes.cbegin(), planeIt)
      || pointInShadow(pointOnPlane, config.light, planeIt + 1, config.planes.cend())
      || pointInShadow(pointOnPlane, config.light, config.spheres.cbegin(), config.spheres.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = planeIt->color * config.ambientCoefficient;
  else
    resultCol = calculateColorInLight(planeIt->color, planeIt->normal, config.light - pointOnPlane);

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(planeIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnPlane}, *planeIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, planeIt->reflectionCoefficient);
}